

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O3

optional<pbrt::SquareMatrix<3>_> * __thiscall
pbrt::PixelSensor::SolveXYZFromSensorRGB
          (optional<pbrt::SquareMatrix<3>_> *__return_storage_ptr__,PixelSensor *this,
          SpectrumHandle *sensorIllum,SpectrumHandle *outputIllum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  optional<pbrt::SquareMatrix<3>_> *poVar3;
  int c;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  Float *pFVar8;
  float fVar9;
  Float FVar10;
  Float FVar11;
  float fVar12;
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Float xyzOutput [24] [3];
  Float rgbCamera [24] [3];
  float local_38c;
  undefined1 local_368 [16];
  SpectrumHandle local_330;
  undefined1 local_328 [16];
  optional<pbrt::SquareMatrix<3>_> *local_310;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_308;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_300;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2f8;
  SpectrumHandle *local_2f0;
  SpectrumHandle local_2e8;
  SpectrumHandle local_2e0;
  SpectrumHandle local_2d8;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2d0;
  SpectrumHandle local_2c8;
  SpectrumHandle local_2c0;
  SpectrumHandle local_2b8;
  SpectrumHandle local_2b0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_2a8;
  SpectrumHandle local_2a0;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_298;
  SpectrumHandle local_290;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_288;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  local_280;
  Float local_278 [72];
  Float local_158 [74];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  
  local_280.bits =
       (outputIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_310 = __return_storage_ptr__;
  local_2f0 = outputIllum;
  IlluminantToSensorRGB(this,(SpectrumHandle *)&local_280);
  if (DAT_030d2cf0 != swatchReflectances) {
    local_2f8.bits = (ulong)&this->r_bar | 0x2000000000000;
    local_300.bits = (ulong)&this->g_bar | 0x2000000000000;
    local_308.bits = (ulong)&this->b_bar | 0x2000000000000;
    pFVar8 = local_158;
    uVar5 = 0;
    do {
      iVar7 = 0x168;
      auVar23 = ZEXT816(0) << 0x40;
      local_330.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)(swatchReflectances + uVar5 * 8);
      local_368 = ZEXT816(0);
      local_38c = 0.0;
      local_2a8.bits =
           (sensorIllum->
           super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           ).bits;
      local_2b0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )local_2f8.bits;
      local_2b8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )local_300.bits;
      local_2c0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                 )local_308.bits;
      do {
        fVar9 = (float)iVar7;
        FVar10 = SpectrumHandle::operator()(&local_2b8,fVar9);
        auVar13._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2a8,fVar9);
        auVar13._4_60_ = extraout_var;
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)local_38c),auVar13._0_16_,ZEXT416((uint)FVar10));
        local_38c = auVar24._0_4_;
        FVar10 = SpectrumHandle::operator()(&local_2b0,fVar9);
        FVar11 = SpectrumHandle::operator()(&local_330,fVar9);
        auVar14._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2a8,fVar9);
        auVar14._4_60_ = extraout_var_00;
        auVar1 = vfmadd213ss_fma(auVar14._0_16_,ZEXT416((uint)(FVar11 * FVar10)),
                                 ZEXT416((uint)local_368._0_4_));
        FVar10 = SpectrumHandle::operator()(&local_2b8,fVar9);
        FVar11 = SpectrumHandle::operator()(&local_330,fVar9);
        auVar15._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2a8,fVar9);
        auVar15._4_60_ = extraout_var_01;
        auVar24 = vmovshdup_avx(local_368);
        local_328 = vfmadd231ss_fma(auVar24,auVar15._0_16_,ZEXT416((uint)(FVar11 * FVar10)));
        local_368 = vinsertps_avx(auVar1,local_328,0x10);
        FVar10 = SpectrumHandle::operator()(&local_2c0,fVar9);
        FVar11 = SpectrumHandle::operator()(&local_330,fVar9);
        auVar16._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2a8,fVar9);
        auVar16._4_60_ = extraout_var_02;
        iVar7 = iVar7 + 1;
        auVar23 = vfmadd231ss_fma(ZEXT416(auVar23._0_4_),auVar16._0_16_,
                                  ZEXT416((uint)(FVar11 * FVar10)));
      } while (iVar7 != 0x33f);
      lVar4 = 0;
      do {
        fVar9 = auVar1._0_4_;
        if (((int)lVar4 != 0) && (fVar9 = local_328._0_4_, (int)lVar4 != 1)) {
          fVar9 = auVar23._0_4_;
        }
        pFVar8[lVar4] = fVar9 / local_38c;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar5 = uVar5 + 1;
      pFVar8 = pFVar8 + 3;
    } while (uVar5 < (ulong)(DAT_030d2cf0 - swatchReflectances >> 3));
  }
  fVar9 = 0.0;
  iVar7 = 0x168;
  local_288.bits =
       (sensorIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_290.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )((ulong)&this->g_bar | 0x2000000000000);
  do {
    FVar10 = SpectrumHandle::operator()((SpectrumHandle *)&local_288,(float)iVar7);
    auVar17._0_4_ = SpectrumHandle::operator()(&local_290,(float)iVar7);
    auVar17._4_60_ = extraout_var_03;
    iVar7 = iVar7 + 1;
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)fVar9),auVar17._0_16_,ZEXT416((uint)FVar10));
    fVar9 = auVar23._0_4_;
  } while (iVar7 != 0x33f);
  auVar23 = ZEXT816(0) << 0x40;
  iVar7 = 0x168;
  local_298.bits =
       (sensorIllum->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_2a0.
  super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
  .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           )(Spectra::y | 0x2000000000000);
  do {
    FVar10 = SpectrumHandle::operator()((SpectrumHandle *)&local_298,(float)iVar7);
    auVar18._0_4_ = SpectrumHandle::operator()(&local_2a0,(float)iVar7);
    auVar18._4_60_ = extraout_var_04;
    iVar7 = iVar7 + 1;
    auVar23 = vfmadd231ss_fma(ZEXT416(auVar23._0_4_),auVar18._0_16_,ZEXT416((uint)FVar10));
  } while (iVar7 != 0x33f);
  if (DAT_030d2cf0 == swatchReflectances) {
    uVar5 = 0;
  }
  else {
    pFVar8 = local_278;
    uVar6 = 0;
    do {
      local_2c8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = *(TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
                *)(swatchReflectances + uVar6 * 8);
      iVar7 = 0x168;
      auVar24 = ZEXT816(0) << 0x40;
      local_368 = ZEXT816(0);
      local_38c = 0.0;
      local_2d0.bits =
           (local_2f0->
           super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
           ).bits;
      local_2d8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::x | 0x2000000000000);
      local_2e0.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::y | 0x2000000000000);
      local_2e8.
      super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
      .bits = (TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
               )(Spectra::z | 0x2000000000000);
      do {
        fVar12 = (float)iVar7;
        FVar10 = SpectrumHandle::operator()(&local_2e0,fVar12);
        auVar19._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2d0,fVar12);
        auVar19._4_60_ = extraout_var_05;
        auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_38c),auVar19._0_16_,ZEXT416((uint)FVar10));
        local_38c = auVar1._0_4_;
        FVar10 = SpectrumHandle::operator()(&local_2d8,fVar12);
        FVar11 = SpectrumHandle::operator()(&local_2c8,fVar12);
        auVar20._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2d0,fVar12);
        auVar20._4_60_ = extraout_var_06;
        auVar2 = vfmadd213ss_fma(auVar20._0_16_,ZEXT416((uint)(FVar11 * FVar10)),
                                 ZEXT416((uint)local_368._0_4_));
        FVar10 = SpectrumHandle::operator()(&local_2e0,fVar12);
        FVar11 = SpectrumHandle::operator()(&local_2c8,fVar12);
        auVar21._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2d0,fVar12);
        auVar21._4_60_ = extraout_var_07;
        auVar1 = vmovshdup_avx(local_368);
        local_328 = vfmadd231ss_fma(auVar1,auVar21._0_16_,ZEXT416((uint)(FVar11 * FVar10)));
        local_368 = vinsertps_avx(auVar2,local_328,0x10);
        FVar10 = SpectrumHandle::operator()(&local_2e8,fVar12);
        FVar11 = SpectrumHandle::operator()(&local_2c8,fVar12);
        auVar22._0_4_ = SpectrumHandle::operator()((SpectrumHandle *)&local_2d0,fVar12);
        auVar22._4_60_ = extraout_var_08;
        iVar7 = iVar7 + 1;
        auVar24 = vfmadd231ss_fma(ZEXT416(auVar24._0_4_),auVar22._0_16_,
                                  ZEXT416((uint)(FVar11 * FVar10)));
      } while (iVar7 != 0x33f);
      lVar4 = 0;
      do {
        fVar12 = auVar2._0_4_;
        if (((int)lVar4 != 0) && (fVar12 = local_328._0_4_, (int)lVar4 != 1)) {
          fVar12 = auVar24._0_4_;
        }
        pFVar8[lVar4] = ((auVar23._0_4_ / 106.856895) / (fVar9 / 106.856895)) * (fVar12 / local_38c)
        ;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
      uVar6 = uVar6 + 1;
      pFVar8 = pFVar8 + 3;
      uVar5 = DAT_030d2cf0 - swatchReflectances >> 3;
    } while (uVar6 < uVar5);
  }
  poVar3 = local_310;
  LinearLeastSquares(local_310,(Float (*) [3])local_158,(Float (*) [3])local_278,(int)uVar5);
  return poVar3;
}

Assistant:

pstd::optional<SquareMatrix<3>> PixelSensor::SolveXYZFromSensorRGB(
    SpectrumHandle sensorIllum, SpectrumHandle outputIllum) const {
    Float rgbCamera[24][3], xyzOutput[24][3];
    // Compute _rgbCamera_ values for training swatches
    RGB outputWhite = IlluminantToSensorRGB(outputIllum);
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        RGB rgb = ProjectReflectance<RGB>(swatchReflectances[i], sensorIllum, &r_bar,
                                          &g_bar, &b_bar);
        for (int c = 0; c < 3; ++c)
            rgbCamera[i][c] = rgb[c];
    }

    // Compute _xyzOutput_ values for training swatches
    Float sensorWhiteG = InnerProduct(sensorIllum, &g_bar);
    Float sensorWhiteY = InnerProduct(sensorIllum, &Spectra::Y());
    for (size_t i = 0; i < swatchReflectances.size(); ++i) {
        SpectrumHandle s = swatchReflectances[i];
        XYZ xyz = ProjectReflectance<XYZ>(s, outputIllum, &Spectra::X(), &Spectra::Y(),
                                          &Spectra::Z()) *
                  (sensorWhiteY / sensorWhiteG);
        for (int c = 0; c < 3; ++c)
            xyzOutput[i][c] = xyz[c];
    }

    return LinearLeastSquares(rgbCamera, xyzOutput, swatchReflectances.size());
}